

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElement::~IfcDistributionControlElement
          (IfcDistributionControlElement *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x93d110;
  *(undefined8 *)&this->field_0x38 = 0x93d228;
  *(undefined8 *)&this[-1].field_0xd8 = 0x93d138;
  *(undefined8 *)&this[-1].field_0xe8 = 0x93d160;
  *(undefined8 *)&this[-1].field_0x120 = 0x93d188;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionControlElement,_1UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0x93d1b0;
  *(undefined8 *)&this[-1].field_0x188 = 0x93d1d8;
  *(undefined8 *)this = 0x93d200;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__0093d248);
  return;
}

Assistant:

IfcDistributionControlElement() : Object("IfcDistributionControlElement") {}